

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O0

void __thiscall OpenMD::DataHolder::validate(DataHolder *this)

{
  bool bVar1;
  pointer ppVar2;
  OpenMDException *this_00;
  ostream *poVar3;
  undefined8 uVar4;
  stringstream ss;
  iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  *in_stack_fffffffffffffdf8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  *in_stack_fffffffffffffe00;
  string *msg;
  stringstream local_1a8 [16];
  string local_198 [11];
  _Self local_20;
  _Base_ptr local_18;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  local_10 [2];
  
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  ::_Rb_tree_iterator(local_10);
  local_18 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
             ::begin(in_stack_fffffffffffffdf8);
  local_10[0]._M_node = local_18;
  do {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
         ::end(in_stack_fffffffffffffdf8);
    bVar1 = std::operator!=(local_10,&local_20);
    if (!bVar1) {
      return;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                           *)0x1f8260);
    bVar1 = ParameterBase::isOptional(ppVar2->second);
    if (!bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                             *)0x1f827e);
      bVar1 = ParameterBase::empty(ppVar2->second);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        msg = local_198;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
                               *)0x1f82b1);
        this_00 = (OpenMDException *)ParameterBase::getKeyword_abi_cxx11_(ppVar2->second);
        poVar3 = std::operator<<((ostream *)msg,(string *)this_00);
        std::operator<<(poVar3," must be set.\n");
        uVar4 = __cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        OpenMDException::OpenMDException(this_00,msg);
        __cxa_throw(uVar4,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
    ::operator++(in_stack_fffffffffffffe00);
  } while( true );
}

Assistant:

virtual void validate() {
      ParamMap::iterator i;
      for (i = parameters_.begin(); i != parameters_.end(); ++i) {
        if (!i->second->isOptional() && i->second->empty()) {
          std::stringstream ss;
          ss << i->second->getKeyword() << " must be set.\n";
          throw OpenMDException(ss.str());
        }
      }
    }